

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O0

char * x11_verify(unsigned_long peer_ip,int peer_port,tree234 *authtree,char *proto,uchar *data,
                 int dlen,X11FakeAuth **auth_ret)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  X11FakeAuth *pXVar4;
  time_t tVar5;
  uint32_t *e;
  uint32_t *puVar6;
  uint *puVar7;
  void *ptr;
  XDMSeen *ret;
  XDMSeen *seen;
  int i;
  time_t tim;
  unsigned_long t;
  X11FakeAuth *auth;
  X11FakeAuth match_dummy;
  int dlen_local;
  uchar *data_local;
  char *proto_local;
  tree234 *authtree_local;
  int peer_port_local;
  unsigned_long peer_ip_local;
  
  match_dummy.share_chan._4_4_ = dlen;
  iVar2 = strcmp(proto,"MIT-MAGIC-COOKIE-1");
  if (iVar2 == 0) {
    auth._0_4_ = 1;
    match_dummy.data._0_4_ = match_dummy.share_chan._4_4_;
    match_dummy._0_8_ = data;
  }
  else {
    iVar2 = strcmp(proto,"XDM-AUTHORIZATION-1");
    if (iVar2 != 0) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e6f0;
      return (char *)peer_ip_local;
    }
    auth._0_4_ = 2;
    match_dummy.datastring = (char *)data;
  }
  pXVar4 = (X11FakeAuth *)find234(authtree,&auth,(cmpfn234)0x0);
  if (pXVar4 == (X11FakeAuth *)0x0) {
    peer_ip_local = (unsigned_long)anon_var_dwarf_2e706;
    return (char *)peer_ip_local;
  }
  if (pXVar4->proto == 2) {
    if (match_dummy.share_chan._4_4_ != 0x18) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e71c;
      return (char *)peer_ip_local;
    }
    if (peer_port == -1) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e732;
      return (char *)peer_ip_local;
    }
    des_decrypt_xdmauth(pXVar4->data + 9,data,0x18);
    if (*(long *)pXVar4->data != *(long *)data) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e748;
      return (char *)peer_ip_local;
    }
    uVar3 = GET_32BIT_MSB_FIRST(data + 8);
    if (uVar3 != peer_ip) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e748;
      return (char *)peer_ip_local;
    }
    uVar1 = GET_16BIT_MSB_FIRST(data + 0xc);
    if ((uint)uVar1 != peer_port) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e748;
      return (char *)peer_ip_local;
    }
    uVar3 = GET_32BIT_MSB_FIRST(data + 0xe);
    for (seen._4_4_ = 0x12; seen._4_4_ < 0x18; seen._4_4_ = seen._4_4_ + 1) {
      if (data[seen._4_4_] != '\0') {
        peer_ip_local = (unsigned_long)anon_var_dwarf_2e748;
        return (char *)peer_ip_local;
      }
    }
    tVar5 = time((time_t *)0x0);
    if (0x960 < ((ulong)uVar3 - tVar5) + 0x4b0) {
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e75e;
      return (char *)peer_ip_local;
    }
    e = (uint32_t *)safemalloc(1,0xc,0);
    *e = uVar3;
    e[1] = *(uint32_t *)(data + 8);
    *(undefined2 *)(e + 2) = *(undefined2 *)(data + 0xc);
    if (pXVar4->xdmseen == (tree234 *)0x0) {
      __assert_fail("auth->xdmseen != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0xf0,
                    "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                   );
    }
    puVar6 = (uint32_t *)add234(pXVar4->xdmseen,e);
    if (puVar6 != e) {
      safefree(e);
      peer_ip_local = (unsigned_long)anon_var_dwarf_2e7a0;
      return (char *)peer_ip_local;
    }
    while( true ) {
      puVar7 = (uint *)index234(pXVar4->xdmseen,0);
      if (puVar7 == (uint *)0x0) {
        __assert_fail("seen != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                      ,0xf9,
                      "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                     );
      }
      if ((ulong)uVar3 - (ulong)*puVar7 < 0x4b1) break;
      ptr = delpos234(pXVar4->xdmseen,0);
      safefree(ptr);
    }
  }
  *auth_ret = pXVar4;
  return (char *)0x0;
}

Assistant:

static const char *x11_verify(unsigned long peer_ip, int peer_port,
                              tree234 *authtree, char *proto,
                              unsigned char *data, int dlen,
                              struct X11FakeAuth **auth_ret)
{
    struct X11FakeAuth match_dummy;    /* for passing to find234 */
    struct X11FakeAuth *auth;

    /*
     * First, do a lookup in our tree to find the only authorisation
     * record that _might_ match.
     */
    if (!strcmp(proto, x11_authnames[X11_MIT])) {
        /*
         * Just look up the whole cookie that was presented to us,
         * which x11_authcmp will compare against the cookies we
         * currently believe in.
         */
        match_dummy.proto = X11_MIT;
        match_dummy.datalen = dlen;
        match_dummy.data = data;
    } else if (!strcmp(proto, x11_authnames[X11_XDM])) {
        /*
         * Look up the first cipher block, against the stored first
         * cipher blocks for the XDM-AUTHORIZATION-1 cookies we
         * currently know. (See comment in x11_invent_fake_auth.)
         */
        match_dummy.proto = X11_XDM;
        match_dummy.xa1_firstblock = data;
    } else {
        return "Unsupported authorisation protocol";
    }

    if ((auth = find234(authtree, &match_dummy, 0)) == NULL)
        return "Authorisation not recognised";

    /*
     * If we're using MIT-MAGIC-COOKIE-1, that was all we needed. If
     * we're doing XDM-AUTHORIZATION-1, though, we have to check the
     * rest of the auth data.
     */
    if (auth->proto == X11_XDM) {
        unsigned long t;
        time_t tim;
        int i;
        struct XDMSeen *seen, *ret;

        if (dlen != 24)
            return "XDM-AUTHORIZATION-1 data was wrong length";
        if (peer_port == -1)
            return "cannot do XDM-AUTHORIZATION-1 without remote address data";
        des_decrypt_xdmauth(auth->data+9, data, 24);
        if (memcmp(auth->data, data, 8) != 0)
            return "XDM-AUTHORIZATION-1 data failed check"; /* cookie wrong */
        if (GET_32BIT_MSB_FIRST(data+8) != peer_ip)
            return "XDM-AUTHORIZATION-1 data failed check";   /* IP wrong */
        if ((int)GET_16BIT_MSB_FIRST(data+12) != peer_port)
            return "XDM-AUTHORIZATION-1 data failed check";   /* port wrong */
        t = GET_32BIT_MSB_FIRST(data+14);
        for (i = 18; i < 24; i++)
            if (data[i] != 0)          /* zero padding wrong */
                return "XDM-AUTHORIZATION-1 data failed check";
        tim = time(NULL);
        if (((unsigned long)t - (unsigned long)tim
             + XDM_MAXSKEW) > 2*XDM_MAXSKEW)
            return "XDM-AUTHORIZATION-1 time stamp was too far out";
        seen = snew(struct XDMSeen);
        seen->time = t;
        memcpy(seen->clientid, data+8, 6);
        assert(auth->xdmseen != NULL);
        ret = add234(auth->xdmseen, seen);
        if (ret != seen) {
            sfree(seen);
            return "XDM-AUTHORIZATION-1 data replayed";
        }
        /* While we're here, purge entries too old to be replayed. */
        for (;;) {
            seen = index234(auth->xdmseen, 0);
            assert(seen != NULL);
            if (t - seen->time <= XDM_MAXSKEW)
                break;
            sfree(delpos234(auth->xdmseen, 0));
        }
    }
    /* implement other protocols here if ever required */

    *auth_ret = auth;
    return NULL;
}